

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

Variable * __thiscall
rsg::VariableScope::allocate(VariableScope *this,VariableType *type,Storage storage,char *name)

{
  pointer *pppVVar1;
  iterator __position;
  Variable *this_00;
  Variable *variable;
  Variable *local_30;
  
  this_00 = (Variable *)operator_new(0x80);
  Variable::Variable(this_00,type,storage,name);
  __position._M_current =
       (this->m_liveVariables).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30 = this_00;
  if (__position._M_current ==
      (this->m_liveVariables).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>::
    _M_realloc_insert<rsg::Variable*const&>
              ((vector<rsg::Variable*,std::allocator<rsg::Variable*>> *)&this->m_liveVariables,
               __position,&local_30);
  }
  else {
    *__position._M_current = this_00;
    pppVVar1 = &(this->m_liveVariables).
                super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  return local_30;
}

Assistant:

Variable* VariableScope::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	Variable* variable = new Variable(type, storage, name);
	try
	{
		m_liveVariables.push_back(variable);
		return variable;
	}
	catch (const std::exception&)
	{
		delete variable;
		throw;
	}
}